

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O1

string * __thiscall Kernel::Signature::functionName_abi_cxx11_(Signature *this,int number)

{
  byte bVar1;
  int iVar2;
  string *psVar3;
  undefined1 *puVar4;
  
  bVar1 = *(byte *)(::Lib::env + 0xa532) | *(byte *)(::Lib::env + 0x913a);
  if ((bVar1 & 1) == 0) {
    if ((this->_foolConstantsDefined == true) && (this->_foolFalse == number)) {
      if (functionName[abi:cxx11](int)::fols_abi_cxx11_ != '\0') {
        return &functionName[abi:cxx11](int)::fols_abi_cxx11_;
      }
      iVar2 = __cxa_guard_acquire(&functionName[abi:cxx11](int)::fols_abi_cxx11_);
      if (iVar2 == 0) {
        return &functionName[abi:cxx11](int)::fols_abi_cxx11_;
      }
      functionName[abi:cxx11](int)::fols_abi_cxx11_._M_dataplus._M_p =
           (pointer)&functionName[abi:cxx11](int)::fols_abi_cxx11_.field_2;
      psVar3 = &functionName[abi:cxx11](int)::fols_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&functionName[abi:cxx11](int)::fols_abi_cxx11_,"$false","");
      __cxa_atexit(std::__cxx11::string::~string,&functionName[abi:cxx11](int)::fols_abi_cxx11_,
                   &__dso_handle);
      puVar4 = &functionName[abi:cxx11](int)::fols_abi_cxx11_;
    }
    else {
      if (((bVar1 & 1) != 0) ||
         ((this->_foolConstantsDefined != true || (this->_foolTrue != number)))) goto LAB_005cd62a;
      if (functionName[abi:cxx11](int)::troo_abi_cxx11_ != '\0') {
        return &functionName[abi:cxx11](int)::troo_abi_cxx11_;
      }
      iVar2 = __cxa_guard_acquire(&functionName[abi:cxx11](int)::troo_abi_cxx11_);
      if (iVar2 == 0) {
        return &functionName[abi:cxx11](int)::troo_abi_cxx11_;
      }
      functionName[abi:cxx11](int)::troo_abi_cxx11_._M_dataplus._M_p =
           (pointer)&functionName[abi:cxx11](int)::troo_abi_cxx11_.field_2;
      psVar3 = &functionName[abi:cxx11](int)::troo_abi_cxx11_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&functionName[abi:cxx11](int)::troo_abi_cxx11_,"$true","");
      __cxa_atexit(std::__cxx11::string::~string,&functionName[abi:cxx11](int)::troo_abi_cxx11_,
                   &__dso_handle);
      puVar4 = &functionName[abi:cxx11](int)::troo_abi_cxx11_;
    }
    __cxa_guard_release(puVar4);
  }
  else {
LAB_005cd62a:
    psVar3 = &(this->_funs)._stack[number]->_name;
  }
  return &((Symbol *)psVar3)->_name;
}

Assistant:

const std::string& Signature::functionName(int number)
{
  // it is safe to reuse "$true" and "$false" for constants
  // because the user cannot define constants with these names herself
  // and the formula, obtained by toString() with "$true" or "$false"
  // in term position would be syntactically valid in FOOL
  if (!env.options->showFOOL() && isFoolConstantSymbol(false,number)) {
    static std::string fols("$false");
    return fols;
  }
  if (!env.options->showFOOL() && isFoolConstantSymbol(true,number)) { 
    static std::string troo("$true");
    return troo;
  }
  return _funs[number]->name();
}